

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O1

void VerticalFilter_SSE2(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  uint8_t uVar24;
  uint8_t uVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t uVar28;
  uint8_t uVar29;
  uint8_t uVar30;
  uint8_t uVar31;
  uint8_t uVar32;
  uint8_t uVar33;
  uint8_t uVar34;
  uint8_t uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  uint8_t uVar40;
  uint8_t uVar41;
  uint8_t uVar42;
  uint8_t uVar43;
  uint8_t uVar44;
  uint8_t uVar45;
  uint8_t uVar46;
  uint8_t uVar47;
  uint8_t uVar48;
  uint8_t uVar49;
  uint8_t uVar50;
  uint8_t uVar51;
  uint8_t uVar52;
  uint8_t uVar53;
  uint8_t uVar54;
  uint8_t uVar55;
  uint8_t uVar56;
  uint8_t uVar57;
  uint8_t uVar58;
  uint8_t uVar59;
  uint8_t uVar60;
  uint8_t uVar61;
  uint8_t uVar62;
  uint8_t uVar63;
  uint8_t uVar64;
  uint8_t uVar65;
  uint8_t uVar66;
  uint uVar67;
  long lVar68;
  int iVar69;
  uint8_t *puVar70;
  ulong uVar71;
  uint8_t *puVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  
  *filtered_data = *data;
  uVar67 = width - 1;
  if ((int)(uVar67 & 0xffffffe0) < 1) {
    uVar71 = 0;
  }
  else {
    uVar71 = 0;
    do {
      puVar70 = data + uVar71;
      uVar5 = puVar70[1];
      uVar6 = puVar70[2];
      uVar7 = puVar70[3];
      uVar8 = puVar70[4];
      uVar9 = puVar70[5];
      uVar10 = puVar70[6];
      uVar11 = puVar70[7];
      uVar12 = puVar70[8];
      uVar13 = puVar70[9];
      uVar14 = puVar70[10];
      uVar15 = puVar70[0xb];
      uVar16 = puVar70[0xc];
      uVar17 = puVar70[0xd];
      uVar18 = puVar70[0xe];
      uVar19 = puVar70[0xf];
      puVar72 = data + uVar71 + 1;
      uVar20 = puVar72[1];
      uVar21 = puVar72[2];
      uVar22 = puVar72[3];
      uVar23 = puVar72[4];
      uVar24 = puVar72[5];
      uVar25 = puVar72[6];
      uVar26 = puVar72[7];
      uVar27 = puVar72[8];
      uVar28 = puVar72[9];
      uVar29 = puVar72[10];
      uVar30 = puVar72[0xb];
      uVar31 = puVar72[0xc];
      uVar32 = puVar72[0xd];
      uVar33 = puVar72[0xe];
      uVar34 = puVar72[0xf];
      puVar2 = data + uVar71 + 0x10;
      uVar35 = *puVar2;
      uVar36 = puVar2[1];
      uVar37 = puVar2[2];
      uVar38 = puVar2[3];
      uVar39 = puVar2[4];
      uVar40 = puVar2[5];
      uVar41 = puVar2[6];
      uVar42 = puVar2[7];
      uVar43 = puVar2[8];
      uVar44 = puVar2[9];
      uVar45 = puVar2[10];
      uVar46 = puVar2[0xb];
      uVar47 = puVar2[0xc];
      uVar48 = puVar2[0xd];
      uVar49 = puVar2[0xe];
      uVar50 = puVar2[0xf];
      puVar2 = data + uVar71 + 0x11;
      uVar51 = *puVar2;
      uVar52 = puVar2[1];
      uVar53 = puVar2[2];
      uVar54 = puVar2[3];
      uVar55 = puVar2[4];
      uVar56 = puVar2[5];
      uVar57 = puVar2[6];
      uVar58 = puVar2[7];
      uVar59 = puVar2[8];
      uVar60 = puVar2[9];
      uVar61 = puVar2[10];
      uVar62 = puVar2[0xb];
      uVar63 = puVar2[0xc];
      uVar64 = puVar2[0xd];
      uVar65 = puVar2[0xe];
      uVar66 = puVar2[0xf];
      puVar2 = filtered_data + uVar71 + 1;
      *puVar2 = *puVar72 - *puVar70;
      puVar2[1] = uVar20 - uVar5;
      puVar2[2] = uVar21 - uVar6;
      puVar2[3] = uVar22 - uVar7;
      puVar2[4] = uVar23 - uVar8;
      puVar2[5] = uVar24 - uVar9;
      puVar2[6] = uVar25 - uVar10;
      puVar2[7] = uVar26 - uVar11;
      puVar2[8] = uVar27 - uVar12;
      puVar2[9] = uVar28 - uVar13;
      puVar2[10] = uVar29 - uVar14;
      puVar2[0xb] = uVar30 - uVar15;
      puVar2[0xc] = uVar31 - uVar16;
      puVar2[0xd] = uVar32 - uVar17;
      puVar2[0xe] = uVar33 - uVar18;
      puVar2[0xf] = uVar34 - uVar19;
      puVar70 = filtered_data + uVar71 + 0x11;
      *puVar70 = uVar51 - uVar35;
      puVar70[1] = uVar52 - uVar36;
      puVar70[2] = uVar53 - uVar37;
      puVar70[3] = uVar54 - uVar38;
      puVar70[4] = uVar55 - uVar39;
      puVar70[5] = uVar56 - uVar40;
      puVar70[6] = uVar57 - uVar41;
      puVar70[7] = uVar58 - uVar42;
      puVar70[8] = uVar59 - uVar43;
      puVar70[9] = uVar60 - uVar44;
      puVar70[10] = uVar61 - uVar45;
      puVar70[0xb] = uVar62 - uVar46;
      puVar70[0xc] = uVar63 - uVar47;
      puVar70[0xd] = uVar64 - uVar48;
      puVar70[0xe] = uVar65 - uVar49;
      puVar70[0xf] = uVar66 - uVar50;
      uVar71 = uVar71 + 0x20;
    } while (uVar71 < (uVar67 & 0xffffffe0));
  }
  if ((int)uVar71 < (int)uVar67) {
    uVar71 = uVar71 & 0xffffffff;
    do {
      filtered_data[uVar71 + 1] = data[uVar71 + 1] - data[uVar71];
      uVar71 = uVar71 + 1;
    } while (uVar67 != uVar71);
  }
  if (1 < height) {
    lVar68 = (long)stride;
    iVar69 = 1;
    lVar75 = 0;
    puVar70 = filtered_data;
    puVar72 = data;
    do {
      puVar2 = puVar72 + lVar68;
      puVar70 = puVar70 + lVar68;
      uVar71 = 0;
      if (0 < (int)(width & 0xffffffe0U)) {
        uVar71 = 0;
        do {
          puVar1 = puVar2 + uVar71;
          uVar5 = puVar1[1];
          uVar6 = puVar1[2];
          uVar7 = puVar1[3];
          uVar8 = puVar1[4];
          uVar9 = puVar1[5];
          uVar10 = puVar1[6];
          uVar11 = puVar1[7];
          uVar12 = puVar1[8];
          uVar13 = puVar1[9];
          uVar14 = puVar1[10];
          uVar15 = puVar1[0xb];
          uVar16 = puVar1[0xc];
          uVar17 = puVar1[0xd];
          uVar18 = puVar1[0xe];
          uVar19 = puVar1[0xf];
          puVar3 = puVar2 + uVar71 + 0x10;
          uVar20 = *puVar3;
          uVar21 = puVar3[1];
          uVar22 = puVar3[2];
          uVar23 = puVar3[3];
          uVar24 = puVar3[4];
          uVar25 = puVar3[5];
          uVar26 = puVar3[6];
          uVar27 = puVar3[7];
          uVar28 = puVar3[8];
          uVar29 = puVar3[9];
          uVar30 = puVar3[10];
          uVar31 = puVar3[0xb];
          uVar32 = puVar3[0xc];
          uVar33 = puVar3[0xd];
          uVar34 = puVar3[0xe];
          uVar35 = puVar3[0xf];
          puVar3 = puVar72 + uVar71;
          uVar36 = puVar3[1];
          uVar37 = puVar3[2];
          uVar38 = puVar3[3];
          uVar39 = puVar3[4];
          uVar40 = puVar3[5];
          uVar41 = puVar3[6];
          uVar42 = puVar3[7];
          uVar43 = puVar3[8];
          uVar44 = puVar3[9];
          uVar45 = puVar3[10];
          uVar46 = puVar3[0xb];
          uVar47 = puVar3[0xc];
          uVar48 = puVar3[0xd];
          uVar49 = puVar3[0xe];
          uVar50 = puVar3[0xf];
          puVar4 = puVar72 + uVar71 + 0x10;
          uVar51 = *puVar4;
          uVar52 = puVar4[1];
          uVar53 = puVar4[2];
          uVar54 = puVar4[3];
          uVar55 = puVar4[4];
          uVar56 = puVar4[5];
          uVar57 = puVar4[6];
          uVar58 = puVar4[7];
          uVar59 = puVar4[8];
          uVar60 = puVar4[9];
          uVar61 = puVar4[10];
          uVar62 = puVar4[0xb];
          uVar63 = puVar4[0xc];
          uVar64 = puVar4[0xd];
          uVar65 = puVar4[0xe];
          uVar66 = puVar4[0xf];
          puVar4 = puVar70 + uVar71;
          *puVar4 = *puVar1 - *puVar3;
          puVar4[1] = uVar5 - uVar36;
          puVar4[2] = uVar6 - uVar37;
          puVar4[3] = uVar7 - uVar38;
          puVar4[4] = uVar8 - uVar39;
          puVar4[5] = uVar9 - uVar40;
          puVar4[6] = uVar10 - uVar41;
          puVar4[7] = uVar11 - uVar42;
          puVar4[8] = uVar12 - uVar43;
          puVar4[9] = uVar13 - uVar44;
          puVar4[10] = uVar14 - uVar45;
          puVar4[0xb] = uVar15 - uVar46;
          puVar4[0xc] = uVar16 - uVar47;
          puVar4[0xd] = uVar17 - uVar48;
          puVar4[0xe] = uVar18 - uVar49;
          puVar4[0xf] = uVar19 - uVar50;
          puVar1 = puVar70 + uVar71 + 0x10;
          *puVar1 = uVar20 - uVar51;
          puVar1[1] = uVar21 - uVar52;
          puVar1[2] = uVar22 - uVar53;
          puVar1[3] = uVar23 - uVar54;
          puVar1[4] = uVar24 - uVar55;
          puVar1[5] = uVar25 - uVar56;
          puVar1[6] = uVar26 - uVar57;
          puVar1[7] = uVar27 - uVar58;
          puVar1[8] = uVar28 - uVar59;
          puVar1[9] = uVar29 - uVar60;
          puVar1[10] = uVar30 - uVar61;
          puVar1[0xb] = uVar31 - uVar62;
          puVar1[0xc] = uVar32 - uVar63;
          puVar1[0xd] = uVar33 - uVar64;
          puVar1[0xe] = uVar34 - uVar65;
          puVar1[0xf] = uVar35 - uVar66;
          uVar71 = uVar71 + 0x20;
        } while (uVar71 < (width & 0xffffffe0U));
      }
      if ((int)uVar71 < width) {
        lVar74 = (ulong)(uint)width - (uVar71 & 0xffffffff);
        lVar73 = (uVar71 & 0xffffffff) + lVar75;
        do {
          filtered_data[lVar73 + lVar68] = data[lVar73 + lVar68] - data[lVar73];
          lVar73 = lVar73 + 1;
          lVar74 = lVar74 + -1;
        } while (lVar74 != 0);
      }
      iVar69 = iVar69 + 1;
      lVar75 = lVar75 + lVar68;
      puVar72 = puVar2;
    } while (iVar69 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoVerticalFilter_SSE2(const uint8_t* in,
                                              int width, int height, int stride,
                                              int row, int num_rows,
                                              uint8_t* out) {
  const size_t start_offset = row * stride;
  const int last_row = row + num_rows;
  SANITY_CHECK(in, out);
  in += start_offset;
  out += start_offset;

  if (row == 0) {
    // Very first top-left pixel is copied.
    out[0] = in[0];
    // Rest of top scan-line is left-predicted.
    PredictLineLeft_SSE2(in + 1, out + 1, width - 1);
    row = 1;
    in += stride;
    out += stride;
  }

  // Filter line-by-line.
  while (row < last_row) {
    PredictLineTop_SSE2(in, in - stride, out, width);
    ++row;
    in += stride;
    out += stride;
  }
}